

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

void __thiscall tinyusdz::ascii::AsciiParser::~AsciiParser(AsciiParser *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  long *plVar5;
  
  p_Var3 = (this->_primspec_fun).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->_primspec_fun,(_Any_data *)&this->_primspec_fun,__destroy_functor)
    ;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_tinyusdz::Path_&,_long,_long)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_tinyusdz::Path_&,_long,_long)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_tinyusdz::Path_&,_long,_long)>_>_>_>
  ::_M_erase(&(this->_post_prim_construct_fun_map)._M_t,
             (_Link_type)
             (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  ::std::_Rb_tree<$d8d97b32$>::_M_erase
            (&(this->_prim_construct_fun_map)._M_t,
             (_Link_type)
             (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  p_Var3 = (this->_stage_meta_process_fun).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->_stage_meta_process_fun,
              (_Any_data *)&this->_stage_meta_process_fun,__destroy_functor);
  }
  p_Var3 = (this->_prim_idx_assign_fun).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->_prim_idx_assign_fun,(_Any_data *)&this->_prim_idx_assign_fun,
              __destroy_functor);
  }
  pcVar4 = (this->_stage_metas).comment.value._M_dataplus._M_p;
  paVar2 = &(this->_stage_metas).comment.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::_M_erase(&(this->_stage_metas).customLayerData._M_t,
             (_Link_type)
             (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  if ((this->_stage_metas).playbackMode.has_value_ == true) {
    plVar5 = *(long **)&(this->_stage_metas).playbackMode.contained;
    plVar1 = (long *)((long)&(this->_stage_metas).playbackMode.contained + 0x10);
    if (plVar5 != plVar1) {
      operator_delete(plVar5,*plVar1 + 1);
    }
  }
  pcVar4 = (this->_stage_metas).doc.value._M_dataplus._M_p;
  paVar2 = &(this->_stage_metas).doc.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->_stage_metas).defaultPrim.str_._M_dataplus._M_p;
  paVar2 = &(this->_stage_metas).defaultPrim.str_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::~vector
            (&(this->_stage_metas).subLayers);
  pcVar4 = (this->_base_dir)._M_dataplus._M_p;
  paVar2 = &(this->_base_dir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  ::std::
  _Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ::~_Deque_base((_Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                  *)&this->parse_stack);
  ::std::
  deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ::~deque(&(this->warn_stack).c);
  ::std::
  deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ::~deque(&(this->err_stack).c);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::_M_erase(&(this->_supported_prop_metas)._M_t,
             (_Link_type)
             (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::_M_erase(&(this->_supported_prim_metas)._M_t,
             (_Link_type)
             (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::_M_erase(&(this->_supported_stage_metas)._M_t,
             (_Link_type)
             (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->_supported_api_schemas,
             (_Link_type)
             (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->_supported_prim_attr_types,
             (_Link_type)
             (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->_supported_prim_types,
             (_Link_type)
             (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->_path_stack).c);
  return;
}

Assistant:

AsciiParser::~AsciiParser() {}